

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetKeyOwner(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiKeyOwnerData *pIVar1;
  bool bVar2;
  bool bVar3;
  
  pIVar1 = GetKeyOwnerData(GImGui,key);
  pIVar1->OwnerNext = owner_id;
  pIVar1->OwnerCurr = owner_id;
  bVar2 = (bool)((byte)((uint)flags >> 0x15) & 1);
  pIVar1->LockUntilRelease = bVar2;
  bVar3 = true;
  if (((uint)flags >> 0x14 & 1) == 0) {
    bVar3 = bVar2;
  }
  pIVar1->LockThisFrame = bVar3;
  return;
}

Assistant:

void ImGui::SetKeyOwner(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(IsNamedKeyOrMod(key) && (owner_id != ImGuiKeyOwner_Any || (flags & (ImGuiInputFlags_LockThisFrame | ImGuiInputFlags_LockUntilRelease)))); // Can only use _Any with _LockXXX flags (to eat a key away without an ID to retrieve it)
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedBySetKeyOwner) == 0); // Passing flags not supported by this function!
    //IMGUI_DEBUG_LOG("SetKeyOwner(%s, owner_id=0x%08X, flags=%08X)\n", GetKeyName(key), owner_id, flags);

    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(&g, key);
    owner_data->OwnerCurr = owner_data->OwnerNext = owner_id;

    // We cannot lock by default as it would likely break lots of legacy code.
    // In the case of using LockUntilRelease while key is not down we still lock during the frame (no key_data->Down test)
    owner_data->LockUntilRelease = (flags & ImGuiInputFlags_LockUntilRelease) != 0;
    owner_data->LockThisFrame = (flags & ImGuiInputFlags_LockThisFrame) != 0 || (owner_data->LockUntilRelease);
}